

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O0

string * ZXing::ToSVG_abi_cxx11_(BitMatrix *matrix)

{
  bool bVar1;
  ostream *poVar2;
  BitMatrix *in_RSI;
  string *in_RDI;
  int x;
  int y;
  ostringstream out;
  int height;
  int width;
  ostream *in_stack_fffffffffffffde8;
  BitMatrix *in_stack_fffffffffffffdf0;
  int local_1a4;
  int local_1a0;
  ostringstream local_190 [376];
  int local_18;
  int local_14;
  BitMatrix *local_10;
  
  local_10 = in_RSI;
  local_14 = BitMatrix::width(in_RSI);
  local_18 = BitMatrix::height(local_10);
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar2 = std::operator<<(poVar2,
                           "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 "
                          );
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  poVar2 = std::operator<<(poVar2,"\" stroke=\"none\">\n");
  std::operator<<(poVar2,"<path d=\"");
  for (local_1a0 = 0; local_1a0 < local_18; local_1a0 = local_1a0 + 1) {
    for (local_1a4 = 0; local_1a4 < local_14; local_1a4 = local_1a4 + 1) {
      bVar1 = BitMatrix::get(in_stack_fffffffffffffdf0,
                             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             (int)in_stack_fffffffffffffde8);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)local_190,"M");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1a4);
        in_stack_fffffffffffffdf0 = (BitMatrix *)std::operator<<(poVar2,",");
        in_stack_fffffffffffffde8 =
             (ostream *)std::ostream::operator<<((ostream *)in_stack_fffffffffffffdf0,local_1a0);
        std::operator<<(in_stack_fffffffffffffde8,"h1v1h-1z");
      }
    }
  }
  std::operator<<((ostream *)local_190,"\"/>\n</svg>");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string ToSVG(const BitMatrix& matrix)
{
	// see https://stackoverflow.com/questions/10789059/create-qr-code-in-vector-image/60638350#60638350

	const int width = matrix.width();
	const int height = matrix.height();
	std::ostringstream out;

	out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
		<< "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 " << width << " " << height
		<< "\" stroke=\"none\">\n"
		<< "<path d=\"";

	for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
			if (matrix.get(x, y))
				out << "M" << x << "," << y << "h1v1h-1z";

	out << "\"/>\n</svg>";

	return out.str();
}